

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O2

void __thiscall
QTextEditPrivate::pageUpDown(QTextEditPrivate *this,MoveOperation op,MoveMode moveMode)

{
  long lVar1;
  QWidgetData *pQVar2;
  MoveMode MVar3;
  qreal qVar4;
  char cVar5;
  long in_FS_OFFSET;
  ulong uVar6;
  double dVar7;
  double dVar8;
  qreal qVar9;
  QRectF local_60;
  QTextCursor cursor;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  _cursor = &DAT_aaaaaaaaaaaaaaaa;
  QWidgetTextControl::textCursor((QWidgetTextControl *)&cursor);
  QWidgetTextControl::cursorRect(&local_60,(QWidgetTextControl *)this->control,&cursor);
  dVar8 = 0.0;
  qVar9 = local_60.yp;
  do {
    QWidgetTextControl::cursorRect(&local_60,(QWidgetTextControl *)this->control,&cursor);
    qVar4 = local_60.yp;
    cVar5 = QTextCursor::movePosition((MoveOperation)(QWidgetTextControl *)&cursor,op,moveMode);
    if (cVar5 == '\0') goto LAB_0045f586;
    dVar7 = qVar4 - qVar9;
    uVar6 = -(ulong)(dVar7 < -dVar7);
    pQVar2 = ((this->super_QAbstractScrollAreaPrivate).viewport)->data;
    dVar8 = dVar8 + (double)(~uVar6 & (ulong)dVar7 | (ulong)-dVar7 & uVar6);
    qVar9 = qVar4;
  } while (dVar8 < (double)(((pQVar2->crect).y2.m_i - (pQVar2->crect).y1.m_i) + 1));
  MVar3 = 2;
  if (op == Up) {
    MVar3 = 0xc;
  }
  QTextCursor::movePosition((MoveOperation)&cursor,MVar3,moveMode);
  QAbstractSlider::triggerAction
            (&((this->super_QAbstractScrollAreaPrivate).vbar)->super_QAbstractSlider,
             (op == Up) + SliderPageStepAdd);
LAB_0045f586:
  QWidgetTextControl::setTextCursor
            ((QWidgetTextControl *)this->control,&cursor,moveMode == KeepAnchor);
  QTextCursor::~QTextCursor(&cursor);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextEditPrivate::pageUpDown(QTextCursor::MoveOperation op, QTextCursor::MoveMode moveMode)
{
    QTextCursor cursor = control->textCursor();
    bool moved = false;
    qreal lastY = control->cursorRect(cursor).top();
    qreal distance = 0;
    // move using movePosition to keep the cursor's x
    do {
        qreal y = control->cursorRect(cursor).top();
        distance += qAbs(y - lastY);
        lastY = y;
        moved = cursor.movePosition(op, moveMode);
    } while (moved && distance < viewport->height());

    if (moved) {
        if (op == QTextCursor::Up) {
            cursor.movePosition(QTextCursor::Down, moveMode);
            vbar->triggerAction(QAbstractSlider::SliderPageStepSub);
        } else {
            cursor.movePosition(QTextCursor::Up, moveMode);
            vbar->triggerAction(QAbstractSlider::SliderPageStepAdd);
        }
    }
    control->setTextCursor(cursor, moveMode == QTextCursor::KeepAnchor);
}